

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_test.cc
# Opt level: O2

void __thiscall ThreadPoolTest_Print_test_Test::TestBody(ThreadPoolTest_Print_test_Test *this)

{
  int iVar1;
  bool bVar2;
  undefined1 local_1b0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  undefined1 local_190 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  ThreadPool pool;
  
  ThreadPool::ThreadPool(&pool,4);
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              ((ThreadPool *)(local_170 + 0x10),(_Bind<void_(*(int))(int)> *)&pool);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158);
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              ((ThreadPool *)local_170,(_Bind<void_(*(int))(int)> *)&pool);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 8));
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              ((ThreadPool *)(local_190 + 0x10),(_Bind<void_(*(int))(int)> *)&pool);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178);
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              ((ThreadPool *)local_190,(_Bind<void_(*(int))(int)> *)&pool);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_190 + 8));
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              ((ThreadPool *)(local_1b0 + 0x10),(_Bind<void_(*(int))(int)> *)&pool);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198);
    ThreadPool::enqueue<std::_Bind<void(*(int))(int)>>
              ((ThreadPool *)local_1b0,(_Bind<void_(*(int))(int)> *)&pool);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b0 + 8));
    ThreadPool::Sync(&pool,6);
    puts("Hello master");
  }
  puts("final");
  usleep(100);
  ThreadPool::~ThreadPool(&pool);
  return;
}

Assistant:

TEST(ThreadPoolTest, Print_test) {
  ThreadPool pool(4);
  for (int i = 0; i < 3; ++i) {
    pool.enqueue(std::bind(func, 1));
    pool.enqueue(std::bind(func, 2));
    pool.enqueue(std::bind(func, 3));
    pool.enqueue(std::bind(func, 4));
    pool.enqueue(std::bind(func, 5));
    pool.enqueue(std::bind(func, 6));
    pool.Sync(6);
    printf("Hello master\n");
  }
  printf("final\n");
#ifndef _MSC_VER
  usleep(100);
#else
  std::this_thread::sleep_for(std::chrono::microseconds(100));
#endif
}